

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

ALLEGRO_USTR * ustr_split_next(ALLEGRO_USTR *ustr,ALLEGRO_USTR_INFO *info,int *pos,char *delimiter)

{
  int iVar1;
  undefined8 in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int size;
  int end;
  ALLEGRO_USTR *result;
  int local_34;
  ALLEGRO_USTR *local_30;
  undefined8 local_28;
  int *local_20;
  undefined8 local_18;
  undefined8 local_10;
  ALLEGRO_USTR *local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = al_ustr_size(in_RDI);
  if (*local_20 < iVar1) {
    local_34 = al_ustr_find_set_cstr(local_10,*local_20,local_28);
    if (local_34 == -1) {
      local_34 = iVar1;
    }
    local_30 = (ALLEGRO_USTR *)al_ref_ustr(local_18,local_10,*local_20,local_34);
    al_ustr_next(local_10,&local_34);
    *local_20 = local_34;
    local_8 = local_30;
  }
  else {
    local_8 = (ALLEGRO_USTR *)0x0;
  }
  return local_8;
}

Assistant:

static const ALLEGRO_USTR *ustr_split_next(const ALLEGRO_USTR *ustr,
   ALLEGRO_USTR_INFO *info, int *pos, const char *delimiter)
{
   const ALLEGRO_USTR *result;
   int end, size;

   size = al_ustr_size(ustr);
   if (*pos >= size) {
      return NULL;
   }

   end = al_ustr_find_set_cstr(ustr, *pos, delimiter);
   if (end == -1)
      end = size;

   result = al_ref_ustr(info, ustr, *pos, end);
   /* Set pos to character AFTER delimiter */
   al_ustr_next(ustr, &end);
   (*pos) = end;
   return result;
}